

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_declare_vtab(sqlite3 *db,char *zCreateTable)

{
  u8 uVar1;
  i16 iVar2;
  long lVar3;
  Table *pTVar4;
  sqlite3 *psVar5;
  long lVar6;
  int iVar7;
  char *zFormat;
  sqlite3 *in_RDI;
  long in_FS_OFFSET;
  Index *pIdx;
  Table *pNew;
  uchar *z;
  int i;
  int initBusy;
  Table *pTab;
  int rc;
  VtabCtx *pCtx;
  int tokenType;
  Parse sParse;
  undefined4 in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  sqlite3 *in_stack_fffffffffffffdf0;
  Parse *in_stack_fffffffffffffe00;
  uchar *in_stack_fffffffffffffe08;
  int local_1e8;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 uVar8;
  Parse *pParse;
  int local_1b8;
  undefined1 local_1b0 [8];
  long local_1a8;
  long local_1a0;
  Table *local_50;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = 0;
  memset(local_1b0,0xaa,0x1a8);
  local_1e8 = 0;
  do {
    if ("\x11\x10"[local_1e8] == '\0') {
      sqlite3_mutex_enter((sqlite3_mutex *)0x146f94);
      pParse = (Parse *)in_RDI->pVtabCtx;
      if ((pParse == (Parse *)0x0) || (pParse->rc != 0)) {
        sqlite3MisuseError(0);
        sqlite3Error(in_RDI,in_stack_fffffffffffffdec);
        sqlite3_mutex_leave((sqlite3_mutex *)0x146fe6);
        local_1b8 = sqlite3MisuseError(0);
      }
      else {
        pTVar4 = (Table *)pParse->zErrMsg;
        sqlite3ParseObjectInit
                  ((Parse *)in_stack_fffffffffffffdf0,
                   (sqlite3 *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        uVar1 = (in_RDI->init).busy;
        (in_RDI->init).busy = '\0';
        iVar7 = sqlite3RunParser(pParse,(char *)CONCAT44(uVar8,in_stack_fffffffffffffe28));
        if (iVar7 == 0) {
          if (pTVar4->aCol == (Column *)0x0) {
            pTVar4->aCol = local_50->aCol;
            sqlite3ExprListDelete
                      (in_stack_fffffffffffffdf0,
                       (ExprList *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
            iVar2 = local_50->nCol;
            pTVar4->nCol = iVar2;
            pTVar4->nNVCol = iVar2;
            pTVar4->tabFlags = local_50->tabFlags & 0x280 | pTVar4->tabFlags;
            local_50->nCol = 0;
            local_50->aCol = (Column *)0x0;
            if (((local_50->tabFlags & 0x80) != 0) &&
               (psVar5 = pParse->db->pVdbe->db, lVar6._0_1_ = psVar5->bBenignMalloc,
               lVar6._1_1_ = psVar5->dfltLockMode, lVar6._2_1_ = psVar5->nextAutovac,
               lVar6._3_1_ = psVar5->suppressErr, lVar6._4_1_ = psVar5->vtabOnConflict,
               lVar6._5_1_ = psVar5->isTransactionSavepoint, lVar6._6_1_ = psVar5->mTrace,
               lVar6._7_1_ = psVar5->noSharedCache, lVar6 != 0)) {
              sqlite3PrimaryKeyIndex(local_50);
            }
            in_stack_fffffffffffffe00 = (Parse *)local_50->pIndex;
            if (in_stack_fffffffffffffe00 != (Parse *)0x0) {
              pTVar4->pIndex = (Index *)in_stack_fffffffffffffe00;
              local_50->pIndex = (Index *)0x0;
              *(Table **)&in_stack_fffffffffffffe00->rc = pTVar4;
            }
          }
          pParse->rc = 1;
        }
        else {
          zFormat = (char *)0x0;
          if (local_1a8 != 0) {
            zFormat = "%s";
          }
          sqlite3ErrorWithMsg(in_RDI,1,zFormat,local_1a8);
          sqlite3DbFree(in_stack_fffffffffffffdf0,
                        (void *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        }
        if (local_1a0 != 0) {
          sqlite3VdbeFinalize((Vdbe *)in_stack_fffffffffffffdf0);
        }
        sqlite3DeleteTable(in_stack_fffffffffffffdf0,
                           (Table *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        sqlite3ParseObjectReset(in_stack_fffffffffffffe00);
        (in_RDI->init).busy = uVar1;
        local_1b8 = sqlite3ApiExit((sqlite3 *)
                                   CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),0);
        sqlite3_mutex_leave((sqlite3_mutex *)0x147242);
      }
LAB_0014724a:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
        return local_1b8;
      }
      __stack_chk_fail();
    }
    sqlite3GetToken(in_stack_fffffffffffffe08,(int *)in_stack_fffffffffffffe00);
    if ("\x11\x10"[local_1e8] != '\0') {
      sqlite3ErrorWithMsg(in_RDI,1,"syntax error");
      local_1b8 = 1;
      goto LAB_0014724a;
    }
    local_1e8 = local_1e8 + 1;
  } while( true );
}

Assistant:

SQLITE_API int sqlite3_declare_vtab(sqlite3 *db, const char *zCreateTable){
  VtabCtx *pCtx;
  int rc = SQLITE_OK;
  Table *pTab;
  Parse sParse;
  int initBusy;
  int i;
  const unsigned char *z;
  static const u8 aKeyword[] = { TK_CREATE, TK_TABLE, 0 };

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zCreateTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif

  /* Verify that the first two keywords in the CREATE TABLE statement
  ** really are "CREATE" and "TABLE".  If this is not the case, then
  ** sqlite3_declare_vtab() is being misused.
  */
  z = (const unsigned char*)zCreateTable;
  for(i=0; aKeyword[i]; i++){
    int tokenType = 0;
    do{
      z += sqlite3GetToken(z, &tokenType);
    }while( tokenType==TK_SPACE || tokenType==TK_COMMENT );
    if( tokenType!=aKeyword[i] ){
      sqlite3ErrorWithMsg(db, SQLITE_ERROR, "syntax error");
      return SQLITE_ERROR;
    }
  }

  sqlite3_mutex_enter(db->mutex);
  pCtx = db->pVtabCtx;
  if( !pCtx || pCtx->bDeclared ){
    sqlite3Error(db, SQLITE_MISUSE_BKPT);
    sqlite3_mutex_leave(db->mutex);
    return SQLITE_MISUSE_BKPT;
  }

  pTab = pCtx->pTab;
  assert( IsVirtual(pTab) );

  sqlite3ParseObjectInit(&sParse, db);
  sParse.eParseMode = PARSE_MODE_DECLARE_VTAB;
  sParse.disableTriggers = 1;
  /* We should never be able to reach this point while loading the
  ** schema.  Nevertheless, defend against that (turn off db->init.busy)
  ** in case a bug arises. */
  assert( db->init.busy==0 );
  initBusy = db->init.busy;
  db->init.busy = 0;
  sParse.nQueryLoop = 1;
  if( SQLITE_OK==sqlite3RunParser(&sParse, zCreateTable) ){
    assert( sParse.pNewTable!=0 );
    assert( !db->mallocFailed );
    assert( IsOrdinaryTable(sParse.pNewTable) );
    assert( sParse.zErrMsg==0 );
    if( !pTab->aCol ){
      Table *pNew = sParse.pNewTable;
      Index *pIdx;
      pTab->aCol = pNew->aCol;
      assert( IsOrdinaryTable(pNew) );
      sqlite3ExprListDelete(db, pNew->u.tab.pDfltList);
      pTab->nNVCol = pTab->nCol = pNew->nCol;
      pTab->tabFlags |= pNew->tabFlags & (TF_WithoutRowid|TF_NoVisibleRowid);
      pNew->nCol = 0;
      pNew->aCol = 0;
      assert( pTab->pIndex==0 );
      assert( HasRowid(pNew) || sqlite3PrimaryKeyIndex(pNew)!=0 );
      if( !HasRowid(pNew)
       && pCtx->pVTable->pMod->pModule->xUpdate!=0
       && sqlite3PrimaryKeyIndex(pNew)->nKeyCol!=1
      ){
        /* WITHOUT ROWID virtual tables must either be read-only (xUpdate==0)
        ** or else must have a single-column PRIMARY KEY */
        rc = SQLITE_ERROR;
      }
      pIdx = pNew->pIndex;
      if( pIdx ){
        assert( pIdx->pNext==0 );
        pTab->pIndex = pIdx;
        pNew->pIndex = 0;
        pIdx->pTable = pTab;
      }
    }
    pCtx->bDeclared = 1;
  }else{
    sqlite3ErrorWithMsg(db, SQLITE_ERROR,
          (sParse.zErrMsg ? "%s" : 0), sParse.zErrMsg);
    sqlite3DbFree(db, sParse.zErrMsg);
    rc = SQLITE_ERROR;
  }
  sParse.eParseMode = PARSE_MODE_NORMAL;

  if( sParse.pVdbe ){
    sqlite3VdbeFinalize(sParse.pVdbe);
  }
  sqlite3DeleteTable(db, sParse.pNewTable);
  sqlite3ParseObjectReset(&sParse);
  db->init.busy = initBusy;

  assert( (rc&0xff)==rc );
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}